

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IndexType.cpp
# Opt level: O2

ostream * amrex::operator<<(ostream *os,IndexType *it)

{
  char cVar1;
  ostream *poVar2;
  char cVar3;
  char cVar4;
  
  poVar2 = std::operator<<(os,'(');
  cVar3 = 'N';
  cVar4 = 'C';
  cVar1 = cVar3;
  if ((it->itype & 1) == 0) {
    cVar1 = cVar4;
  }
  poVar2 = std::operator<<(poVar2,cVar1);
  poVar2 = std::operator<<(poVar2,',');
  cVar1 = cVar3;
  if ((it->itype & 2) == 0) {
    cVar1 = cVar4;
  }
  poVar2 = std::operator<<(poVar2,cVar1);
  poVar2 = std::operator<<(poVar2,',');
  if ((it->itype & 4) == 0) {
    cVar3 = cVar4;
  }
  poVar2 = std::operator<<(poVar2,cVar3);
  std::operator<<(poVar2,')');
  std::ostream::flush();
  if (((byte)os[*(long *)(*(long *)os + -0x18) + 0x20] & 5) != 0) {
    Error_host("operator<<(ostream&,IndexType&) failed");
  }
  return os;
}

Assistant:

std::ostream&
operator<< (std::ostream&    os,
            const IndexType& it)
{
    os << '('
       << AMREX_D_TERM( (it.test(0)?'N':'C'),
                  << ',' << (it.test(1)?'N':'C'),
                  << ',' << (it.test(2)?'N':'C')) << ')' << std::flush;

    if (os.fail())
        amrex::Error("operator<<(ostream&,IndexType&) failed");

    return os;
}